

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b8a13::CAPIBuildSystemFrontendDelegate::commandFinished
          (CAPIBuildSystemFrontendDelegate *this,Command *command,ProcessStatus commandResult)

{
  _func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_command_result_t *p_Var1;
  void *pvVar2;
  llb_buildsystem_command_result_t lVar3;
  ProcessStatus commandResult_local;
  Command *command_local;
  CAPIBuildSystemFrontendDelegate *this_local;
  
  if ((this->cAPIDelegate).command_finished !=
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_command_result_t *)0x0) {
    p_Var1 = (this->cAPIDelegate).command_finished;
    pvVar2 = (this->cAPIDelegate).context;
    lVar3 = get_command_result(commandResult);
    (*p_Var1)(pvVar2,(llb_buildsystem_command_t *)command,lVar3);
  }
  return;
}

Assistant:

virtual void commandFinished(Command* command, ProcessStatus commandResult) override {
    if (cAPIDelegate.command_finished) {
      cAPIDelegate.command_finished(
          cAPIDelegate.context,
          (llb_buildsystem_command_t*) command,
          get_command_result(commandResult));
    }
  }